

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O1

void __thiscall itis::AVLTree<long_long>::erase(AVLTree<long_long> *this,longlong value)

{
  AVLTreeNode<long_long> **ppAVar1;
  long lVar2;
  AVLTreeNode<long_long> *pAVar3;
  bool bVar4;
  AVLTreeNode<long_long> **indirect;
  vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_> path;
  AVLTreeNode<long_long> **local_70;
  vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_> local_68
  ;
  AVLTreeNode<long_long> *local_48;
  vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_> local_40
  ;
  
  local_70 = &this->root;
  local_68.
  super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
  ._M_impl.super__Vector_impl_data._M_finish = (AVLTreeNode<long_long> ***)0x0;
  local_68.
  super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (AVLTreeNode<long_long> ***)0x0;
  bVar4 = this->root == (AVLTreeNode<long_long> *)0x0;
  if (bVar4) goto LAB_0010589f;
  if (this->root->value != value) {
    do {
      if (local_68.
          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_68.
          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<itis::AVLTreeNode<long_long>**,std::allocator<itis::AVLTreeNode<long_long>**>>::
        _M_realloc_insert<itis::AVLTreeNode<long_long>**const&>
                  ((vector<itis::AVLTreeNode<long_long>**,std::allocator<itis::AVLTreeNode<long_long>**>>
                    *)&local_68,
                   (iterator)
                   local_68.
                   super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_70);
      }
      else {
        *local_68.
         super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_70;
        local_68.
        super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_70 = &(*local_70)->right + (value < (*local_70)->value);
      bVar4 = *local_70 == (AVLTreeNode<long_long> *)0x0;
      if (bVar4) goto LAB_0010589f;
    } while ((*local_70)->value != value);
  }
  if (bVar4) goto LAB_0010589f;
  if (local_68.
      super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_68.
      super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<itis::AVLTreeNode<long_long>**,std::allocator<itis::AVLTreeNode<long_long>**>>::
    _M_realloc_insert<itis::AVLTreeNode<long_long>**const&>
              ((vector<itis::AVLTreeNode<long_long>**,std::allocator<itis::AVLTreeNode<long_long>**>>
                *)&local_68,
               (iterator)
               local_68.
               super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_70);
  }
  else {
    *local_68.
     super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
     ._M_impl.super__Vector_impl_data._M_finish = local_70;
    local_68.
    super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  lVar2 = (long)local_68.
                super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68.
                super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = *local_70;
  if ((pAVar3->left == (AVLTreeNode<long_long> *)0x0) &&
     (pAVar3->right == (AVLTreeNode<long_long> *)0x0)) {
    operator_delete(pAVar3,0x20);
    *local_70 = (AVLTreeNode<long_long> *)0x0;
LAB_00105864:
    local_68.
    super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  else {
    if (pAVar3->right == (AVLTreeNode<long_long> *)0x0) {
      *local_70 = pAVar3->left;
      operator_delete(pAVar3,0x20);
      goto LAB_00105864;
    }
    local_48 = *local_70;
    pAVar3 = local_48->right;
    if (pAVar3->left != (AVLTreeNode<long_long> *)0x0) {
      do {
        if (local_68.
            super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_68.
            super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<itis::AVLTreeNode<long_long>**,std::allocator<itis::AVLTreeNode<long_long>**>>
          ::_M_realloc_insert<itis::AVLTreeNode<long_long>**const&>
                    ((vector<itis::AVLTreeNode<long_long>**,std::allocator<itis::AVLTreeNode<long_long>**>>
                      *)&local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (AVLTreeNode<long_long> ***)&local_48);
        }
        else {
          *local_68.
           super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
           ._M_impl.super__Vector_impl_data._M_finish = &local_48->right;
          local_68.
          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        ppAVar1 = &local_48->right;
        local_48 = (AVLTreeNode<long_long> *)&(*ppAVar1)->left;
        pAVar3 = (*ppAVar1)->left;
      } while (pAVar3->left != (AVLTreeNode<long_long> *)0x0);
    }
    if (pAVar3 == (*local_70)->right) {
      pAVar3->left = (*local_70)->left;
      pAVar3 = *local_70;
      *local_70 = local_48->right;
      if (pAVar3 != (AVLTreeNode<long_long> *)0x0) {
        operator_delete(pAVar3,0x20);
      }
    }
    else {
      (*local_68.
        super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1])->left = pAVar3->right;
      pAVar3->left = (*local_70)->left;
      pAVar3->right = (*local_70)->right;
      if (*local_70 != (AVLTreeNode<long_long> *)0x0) {
        operator_delete(*local_70,0x20);
      }
      *local_70 = pAVar3;
      *(AVLTreeNode<long_long> **)
       ((long)local_68.
              super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar2) = pAVar3;
    }
  }
  std::vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>::
  vector(&local_40,&local_68);
  balance(this,&local_40);
  if (local_40.
      super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  this->_size = this->_size + -1;
LAB_0010589f:
  if (local_68.
      super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AVLTree<T>::erase(T value) {
    AVLTreeNode<T> **indirect = &root;    // to generalize insertion
    std::vector<AVLTreeNode<T> **> path;  // to update height values

    while (*indirect != nullptr and (*indirect)->value != value) {
      path.push_back(indirect);

      if ((*indirect)->value > value) {
        indirect = &((*indirect)->left);
      } else {
        indirect = &((*indirect)->right);
      }
    }

    if (*indirect == nullptr) {  // the value does not exist in tree
      return;                    // may be raising an Exception is more elegant
    }

    path.push_back(indirect);

    std::size_t index = path.size();

    if ((*indirect)->left == nullptr and (*indirect)->right == nullptr) {  // the node is leaf
      delete *indirect;                                                    // just delete node
      *indirect = nullptr;
      path.pop_back();  // pop the deleted node from path
    }

    else if ((*indirect)->right == nullptr) {  // only left child exists
      AVLTreeNode<T> *toRemove = *indirect;

      (*indirect) = (*indirect)->left;
      delete toRemove;

      path.pop_back();
    }

    else {  // right child exists
      AVLTreeNode<T> **successor = &((*indirect)->right);

      while ((*successor)->left != nullptr) {
        path.push_back(successor);
        successor = &((*successor)->left);
      }

      if (*successor == (*indirect)->right) {
        (*successor)->left = (*indirect)->left;

        AVLTreeNode<T> *toRemove = *indirect;
        *indirect = *successor;
        delete toRemove;
      }

      else {
        AVLTreeNode<T> *tmp = *path.back();
        AVLTreeNode<T> *suc = *successor;

        tmp->left = (*successor)->right;
        suc->left = (*indirect)->left;
        suc->right = (*indirect)->right;

        delete *indirect;
        *indirect = suc;
        path[index] = &(suc->right);
      }
    }

    balance(path);
    _size--;
  }